

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O1

uchar * ableton::link::v1::detail::
        encodeMessage<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>,unsigned_char*>
                  (MessageType messageType,
                  Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
                  *payload,uchar *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uchar *puVar4;
  uchar *puVar5;
  long lVar6;
  
  lVar6 = 0;
  puVar4 = out + 0x21;
  do {
    puVar5 = puVar4;
    puVar5[-0x21] = (&kProtocolHeader)[lVar6];
    lVar6 = lVar6 + 1;
    puVar4 = puVar5 + 1;
  } while (lVar6 != 8);
  puVar5[-0x20] = messageType;
  uVar1 = (payload->mFirst).header.key;
  uVar2 = (payload->mFirst).header.size;
  *(uint *)(puVar5 + -0x1f) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  *(uint *)(puVar5 + -0x1b) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar3 = (payload->mFirst).value.time.__r;
  *(ulong *)(puVar5 + -0x17) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar1 = (payload->mRest).mFirst.header.key;
  uVar2 = (payload->mRest).mFirst.header.size;
  *(uint *)(puVar5 + -0xf) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  *(uint *)(puVar5 + -0xb) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar3 = (payload->mRest).mFirst.value.time.__r;
  *(ulong *)(puVar5 + -7) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  return puVar5 + 1;
}

Assistant:

It encodeMessage(const MessageType messageType, const Payload& payload, It out)
{
  using namespace std;
  const MessageHeader header = {messageType};
  const auto messageSize =
    kProtocolHeader.size() + sizeInByteStream(header) + sizeInByteStream(payload);

  if (messageSize < kMaxMessageSize)
  {
    return toNetworkByteStream(
      payload, toNetworkByteStream(
                 header, copy(begin(kProtocolHeader), end(kProtocolHeader), move(out))));
  }
  else
  {
    throw range_error("Exceeded maximum message size");
  }
}